

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_types.cpp
# Opt level: O0

void anon_unknown.dwarf_b26e9::flush_index<(pstore::trailer::indices)4>
               (transaction_base *transaction,index_records_array *locations,uint generation)

{
  bool bVar1;
  type tVar2;
  element_type *this;
  typed_address<pstore::index::header_block> tVar3;
  reference pvVar4;
  undefined1 local_38 [8];
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  index;
  database *db;
  uint generation_local;
  index_records_array *locations_local;
  transaction_base *transaction_local;
  
  index.
  super___shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pstore::transaction_base::db(transaction);
  pstore::index::
  get_index<(pstore::trailer::indices)4,pstore::database,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            ((index *)local_38,
             (database *)
             index.
             super___shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi,false);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (bVar1) {
    this = std::
           __shared_ptr_access<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
    tVar3 = pstore::index::
            hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
            ::flush(this,transaction,generation);
    tVar2 = index_integral(path);
    pvVar4 = std::array<pstore::typed_address<pstore::index::header_block>,_6UL>::operator[]
                       (locations,(ulong)tVar2);
    (pvVar4->a_).a_ = (value_type)tVar3.a_.a_;
  }
  std::
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  ::~shared_ptr((shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
                 *)local_38);
  return;
}

Assistant:

void flush_index (pstore::transaction_base & transaction,
                      pstore::trailer::index_records_array * const locations,
                      unsigned const generation) {
        pstore::database & db = transaction.db ();
        if (auto const index = pstore::index::get_index<Index> (db, false /*create*/)) {
            (*locations)[index_integral (Index)] = index->flush (transaction, generation);
        }
    }